

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_guard.hpp
# Opt level: O2

void __thiscall
sg::detail::scope_guard<const_std::function<void_()>,_void>::~scope_guard
          (scope_guard<const_std::function<void_()>,_void> *this)

{
  if (this->m_active == true) {
    Catch::clara::std::function<void_()>::operator()(&this->m_callback);
  }
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

sg::detail::scope_guard<Callback>::scope_guard::~scope_guard() noexcept  /*
need the extra injected-class-name here to make different compilers happy */
{
  if(m_active)
    m_callback();
}